

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int secp_key_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,ptls_iovec_t *secret,
                     ptls_iovec_t peerkey)

{
  EC_GROUP *group_00;
  long in_RDI;
  int ret;
  BN_CTX *bn_ctx;
  EC_GROUP *group;
  ptls_iovec_t *in_stack_00000048;
  EC_GROUP *in_stack_00000050;
  undefined1 in_stack_00000058 [16];
  undefined4 local_3c;
  undefined8 local_38;
  
  local_38 = (BN_CTX *)0x0;
  group_00 = EC_GROUP_new_by_curve_name((int)*(undefined8 *)(in_RDI + 0x18));
  if (group_00 == (EC_GROUP *)0x0) {
    local_3c = 0x203;
  }
  else {
    local_38 = BN_CTX_new();
    if (local_38 == (BN_CTX *)0x0) {
      local_3c = 0x201;
    }
    else {
      local_3c = x9_62_key_exchange(in_stack_00000050,in_stack_00000048,(ptls_iovec_t *)peerkey.len,
                                    (ptls_iovec_t)in_stack_00000058,(BN_CTX *)peerkey.base);
    }
  }
  if (local_38 != (BN_CTX *)0x0) {
    BN_CTX_free(local_38);
  }
  if (group_00 != (EC_GROUP *)0x0) {
    EC_GROUP_free(group_00);
  }
  return local_3c;
}

Assistant:

static int secp_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    EC_GROUP *group = NULL;
    BN_CTX *bn_ctx = NULL;
    int ret;

    if ((group = EC_GROUP_new_by_curve_name((int)algo->data)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((bn_ctx = BN_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = x9_62_key_exchange(group, pubkey, secret, peerkey, bn_ctx);

Exit:
    if (bn_ctx != NULL)
        BN_CTX_free(bn_ctx);
    if (group != NULL)
        EC_GROUP_free(group);
    return ret;
}